

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validatePart
          (Validator *this,uint8_t *ptr,size_t length,bool isSubPart)

{
  uint uVar1;
  undefined8 uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  Exception *this_00;
  char *msg;
  byte in_CL;
  long in_RDX;
  byte *in_RSI;
  long *in_RDI;
  ValueLength byteSize;
  ValueLength len;
  uint8_t *p;
  ValueType type;
  uint8_t head;
  ExceptionType in_stack_ffffffffffffff3c;
  bool isSubPart_00;
  Exception *in_stack_ffffffffffffff40;
  uint8_t *in_stack_ffffffffffffff48;
  ExceptionType EVar5;
  Exception *in_stack_ffffffffffffff50;
  uint8_t *in_stack_ffffffffffffff58;
  Validator *in_stack_ffffffffffffff60;
  unsigned_long local_38;
  byte *local_30;
  Slice local_28;
  ValueType local_1b;
  byte local_1a;
  byte local_19;
  byte *local_10;
  
  local_19 = in_CL & 1;
  if (in_RDX == 0) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (char *)in_stack_ffffffffffffff40);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  local_1a = *in_RSI;
  local_10 = in_RSI;
  Slice::Slice(&local_28,in_RSI);
  local_1b = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        in_stack_ffffffffffffff40);
  if ((local_1b == None) && (local_1a != 0)) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  isSubPart_00 = SUB41(in_stack_ffffffffffffff3c >> 0x18,0);
  switch(local_1b) {
  case None:
  case Illegal:
  case Null:
  case Bool:
  case Double:
  case UTCDate:
  case MinKey:
  case MaxKey:
  case Int:
  case UInt:
  case SmallInt:
  case Binary:
    break;
  case Array:
    uVar1 = (int)in_RDI[1] + 1;
    *(uint *)(in_RDI + 1) = uVar1;
    if (*(uint *)(*in_RDI + 0x2c) <= uVar1) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    validateArray((Validator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                  (size_t)in_stack_ffffffffffffff40);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
    break;
  case Object:
    uVar1 = (int)in_RDI[1] + 1;
    *(uint *)(in_RDI + 1) = uVar1;
    if (*(uint *)(*in_RDI + 0x2c) <= uVar1) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    validateObject((Validator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (size_t)in_stack_ffffffffffffff40);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
    break;
  case External:
    if ((*(byte *)(*in_RDI + 0x27) & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    validateBufferLength
              ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
               (size_t)in_stack_ffffffffffffff40,isSubPart_00);
    break;
  case String:
    if (local_1a == 0xbf) {
      validateBufferLength
                ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40,isSubPart_00);
      local_38 = readIntegerFixed<unsigned_long,8ul>(local_10 + 1);
      local_30 = local_10 + 9;
      validateBufferLength
                ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
    }
    else {
      local_38 = (unsigned_long)(local_1a - 0x40);
      local_30 = local_10 + 1;
      validateBufferLength
                ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40,isSubPart_00);
    }
    if (((*(byte *)(*in_RDI + 0x1e) & 1) != 0) &&
       (uVar3 = (*(code *)ValidateUtf8String)(local_30,local_38), (uVar3 & 1) == 0)) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    break;
  case BCD:
    if ((*(byte *)(*in_RDI + 0x2a) & 1) == 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    if ((*(byte *)(*in_RDI + 0x28) & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    if ((((local_1a != 0xf0) && (local_1a != 0xf1)) && (local_1a != 0xf2)) && (local_1a != 0xf3)) {
      if ((local_1a < 0xf4) || (0xf6 < local_1a)) {
        if ((local_1a < 0xf7) || (0xf9 < local_1a)) {
          if ((local_1a < 0xfa) || (0xfc < local_1a)) {
            if (0xfc < local_1a) {
              validateBufferLength
                        ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                         (size_t)in_stack_ffffffffffffff40,isSubPart_00);
              uVar4 = readIntegerNonEmpty<unsigned_long>
                                (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
              EVar5 = (ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
              if (uVar4 == 0) {
                msg = (char *)__cxa_allocate_exception(0x18);
                Exception::Exception(in_stack_ffffffffffffff50,EVar5,msg);
                __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
              }
            }
          }
          else {
            validateBufferLength
                      ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                       (size_t)in_stack_ffffffffffffff40,isSubPart_00);
            uVar4 = readIntegerNonEmpty<unsigned_long>
                              (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
            if (uVar4 == 0) {
              uVar2 = __cxa_allocate_exception(0x18);
              Exception::Exception
                        (in_stack_ffffffffffffff50,(ExceptionType)((ulong)uVar2 >> 0x20),
                         (char *)in_stack_ffffffffffffff40);
              __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
            }
          }
        }
        else {
          validateBufferLength
                    ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                     (size_t)in_stack_ffffffffffffff40,isSubPart_00);
          uVar4 = readIntegerNonEmpty<unsigned_long>
                            (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
          EVar5 = (ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          if (uVar4 == 0) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception(this_00,EVar5,(char *)in_stack_ffffffffffffff40);
            __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
          }
        }
      }
      else {
        validateBufferLength
                  ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
                   (size_t)in_stack_ffffffffffffff40,isSubPart_00);
        uVar4 = readIntegerNonEmpty<unsigned_long>
                          (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
        EVar5 = (ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        if (uVar4 == 0) {
          uVar2 = __cxa_allocate_exception(0x18);
          Exception::Exception(in_stack_ffffffffffffff50,EVar5,(char *)in_stack_ffffffffffffff40);
          __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
    validateSliceLength(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        (size_t)in_stack_ffffffffffffff50,
                        SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
    break;
  case Tagged:
    if ((*(byte *)(*in_RDI + 0x29) & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    validateTagged(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (size_t)in_stack_ffffffffffffff50);
  }
  validateSliceLength(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      (size_t)in_stack_ffffffffffffff50,
                      SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  return;
}

Assistant:

void Validator::validatePart(uint8_t const* ptr, std::size_t length,
                             bool isSubPart) {
  if (length == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "length 0 is invalid for any VelocyPack value");
  }

  uint8_t head = *ptr;

  // type() only reads the first byte, which is safe
  ValueType const type = Slice(ptr).type();

  if (type == ValueType::None && head != 0x00U) {
    // invalid type
    throw Exception(Exception::ValidatorInvalidType);
  }

  // special handling for certain types...
  switch (type) {
    case ValueType::None:
    case ValueType::Null:
    case ValueType::Bool:
    case ValueType::MinKey:
    case ValueType::MaxKey:
    case ValueType::SmallInt:
    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::Double:
    case ValueType::UTCDate:
    case ValueType::Binary:
    case ValueType::Illegal: {
      break;
    }

    case ValueType::String: {
      uint8_t const* p;
      ValueLength len;
      if (head == 0xbfU) {
        // long UTF-8 string. must be at least 9 bytes long so we
        // can read the entire string length safely
        validateBufferLength(1 + 8, length, true);
        len = readIntegerFixed<ValueLength, 8>(ptr + 1);
        p = ptr + 1 + 8;
        validateBufferLength(len + 1 + 8, length, true);
      } else {
        len = head - 0x40U;
        p = ptr + 1;
        validateBufferLength(len + 1, length, true);
      }

      if (options->validateUtf8Strings &&
          !ValidateUtf8String(p, static_cast<std::size_t>(len))) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }
      break;
    }

    case ValueType::Array: {
      if (++_nesting >= options->nestingLimit) {
        throw Exception(Exception::TooDeepNesting);
      }
      validateArray(ptr, length);
      --_nesting;
      break;
    }

    case ValueType::Object: {
      if (++_nesting >= options->nestingLimit) {
        throw Exception(Exception::TooDeepNesting);
      }
      validateObject(ptr, length);
      --_nesting;
      break;
    }

    case ValueType::BCD: {
      if (options->disallowBCD) {
        throw Exception(Exception::BuilderBCDDisallowed);
      }
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Tagged: {
      if (options->disallowTags) {
        throw Exception(Exception::BuilderTagsDisallowed);
      }
      validateTagged(ptr, length);
      break;
    }

    case ValueType::External: {
      // check if Externals are forbidden
      if (options->disallowExternals) {
        throw Exception(Exception::BuilderExternalsDisallowed);
      }
      // validate if Slice length exceeds the given buffer
      validateBufferLength(1 + sizeof(void*), length, true);
      // do not perform pointer validation
      break;
    }

    case ValueType::Custom: {
      if (options->disallowCustom) {
        throw Exception(Exception::BuilderCustomDisallowed);
      }
      ValueLength byteSize = 0;

      if (head == 0xf0U) {
        byteSize = 1 + 1;
      } else if (head == 0xf1U) {
        byteSize = 1 + 2;
      } else if (head == 0xf2U) {
        byteSize = 1 + 4;
      } else if (head == 0xf3U) {
        byteSize = 1 + 8;
      } else if (head >= 0xf4U && head <= 0xf6U) {
        validateBufferLength(1 + 1, length, true);
        byteSize = 1 + 1 + readIntegerNonEmpty<ValueLength>(ptr + 1, 1);
        if (byteSize == 1 + 1) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xf7U && head <= 0xf9U) {
        validateBufferLength(1 + 2, length, true);
        byteSize = 1 + 2 + readIntegerNonEmpty<ValueLength>(ptr + 1, 2);
        if (byteSize == 1 + 2) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xfaU && head <= 0xfcU) {
        validateBufferLength(1 + 4, length, true);
        byteSize = 1 + 4 + readIntegerNonEmpty<ValueLength>(ptr + 1, 4);
        if (byteSize == 1 + 4) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xfdU) {
        validateBufferLength(1 + 8, length, true);
        byteSize = 1 + 8 + readIntegerNonEmpty<ValueLength>(ptr + 1, 8);
        if (byteSize == 1 + 8) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      }

      validateSliceLength(ptr, byteSize, isSubPart);
      break;
    }
  }

  // common validation that must happen for all types
  validateSliceLength(ptr, length, isSubPart);
}